

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.h
# Opt level: O3

DeviceTy * __thiscall DeviceTy::operator=(DeviceTy *this,DeviceTy *d)

{
  this->DeviceID = d->DeviceID;
  this->RTL = d->RTL;
  this->RTLDeviceID = d->RTLDeviceID;
  this->IsInit = d->IsInit;
  this->HasPendingGlobals = d->HasPendingGlobals;
  if (this != d) {
    std::__cxx11::list<HostDataToTargetTy,std::allocator<HostDataToTargetTy>>::
    _M_assign_dispatch<std::_List_const_iterator<HostDataToTargetTy>>
              ((list<HostDataToTargetTy,std::allocator<HostDataToTargetTy>> *)
               &this->HostDataToTargetMap,
               (d->HostDataToTargetMap).
               super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl.
               _M_node.super__List_node_base._M_next,&d->HostDataToTargetMap);
  }
  std::
  _Rb_tree<__tgt_bin_desc_*,_std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>,_std::_Select1st<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>,_std::less<__tgt_bin_desc_*>,_std::allocator<std::pair<__tgt_bin_desc_*const,_PendingCtorDtorListsTy>_>_>
  ::operator=(&(this->PendingCtorsDtors)._M_t,&(d->PendingCtorsDtors)._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_ShadowPtrValTy>,_std::_Select1st<std::pair<void_*const,_ShadowPtrValTy>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ShadowPtrValTy>_>_>
  ::operator=(&(this->ShadowPtrMap)._M_t,&(d->ShadowPtrMap)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_unsigned_long>,_std::_Select1st<std::pair<const_int,_unsigned_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  ::operator=(&(this->LoopTripCnt)._M_t,&(d->LoopTripCnt)._M_t);
  this->RTLRequiresFlags = d->RTLRequiresFlags;
  return this;
}

Assistant:

DeviceTy& operator=(const DeviceTy &d) {
    DeviceID = d.DeviceID;
    RTL = d.RTL;
    RTLDeviceID = d.RTLDeviceID;
    IsInit = d.IsInit;
    HasPendingGlobals = d.HasPendingGlobals;
    HostDataToTargetMap = d.HostDataToTargetMap;
    PendingCtorsDtors = d.PendingCtorsDtors;
    ShadowPtrMap = d.ShadowPtrMap;
    LoopTripCnt = d.LoopTripCnt;
    RTLRequiresFlags = d.RTLRequiresFlags;

    return *this;
  }